

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_min_object.h
# Opt level: O2

strings * __thiscall
c74::min::object<TestObject,(c74::min::threadsafe)1>::tags_abi_cxx11_
          (strings *__return_storage_ptr__,void *this)

{
  pointer pbVar1;
  strings *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a_tag;
  pointer s;
  string local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  get_tags<TestObject>(__return_storage_ptr__);
  pbVar1 = (__return_storage_ptr__->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (s = (__return_storage_ptr__->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start; s != pbVar1; s = s + 1) {
    min::str::trim(&local_40,s);
    std::__cxx11::string::operator=((string *)s,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual strings tags() const override
    {
        strings t;
        get_tags<min_class_type>(t);
        for (auto& a_tag : t) {
            a_tag = str::trim(a_tag);
        }
        return t;
    }